

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O2

size_t cesl_long_to_str(long value,char *dst_str,uint8_t base)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  bool bVar8;
  char acStack_48 [72];
  
  bVar8 = (int)CONCAT71(in_register_00000011,base) != 10;
  lVar2 = -value;
  if (-1 < value || bVar8) {
    lVar2 = value;
  }
  uVar7 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  for (sVar4 = 0; sVar4 == 0 || lVar2 != 0; sVar4 = sVar4 + 1) {
    cVar6 = (char)(lVar2 % (long)uVar7);
    cVar1 = 'W';
    if (cVar6 < '\n') {
      cVar1 = '0';
    }
    acStack_48[sVar4] = cVar1 + cVar6;
    lVar2 = lVar2 / (long)uVar7;
  }
  if ((long)sVar4 < 1) {
    __assert_fail("(len > 0)&&(\"cesl_int64_to_str negative lenght\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                  ,0x20,"size_t cesl_int64_to_str(int64_t, char *, uint8_t)");
  }
  sVar3 = sVar4;
  if (-1 >= value && !bVar8) {
    *dst_str = '-';
    dst_str = dst_str + 1;
    sVar3 = sVar4 + 1;
  }
  for (pcVar5 = acStack_48 + sVar4; acStack_48 < pcVar5; pcVar5 = pcVar5 + -1) {
    *dst_str = pcVar5[-1];
    dst_str = dst_str + 1;
  }
  *dst_str = '\0';
  return sVar3;
}

Assistant:

size_t cesl_long_to_str(long value, char* dst_str, uint8_t base)
{
#if (LONG_MAX == INT64_MAX)
    return cesl_int64_to_str(value, dst_str, base);
#elif (LONG_MAX == INT32_MAX)
    return cesl_int32_to_str(value, dst_str, base);
#else
#error cesl_long_to_string__not_supported_on_this_platfform
#endif
}